

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank_parser.cc
# Opt level: O2

void __thiscall rank::parser::Parser::R(Parser *this,int d)

{
  bool bVar1;
  Rank *pRVar2;
  
  if ((this->_token_available != false) && ((this->_token)._type == TK_LBracket)) {
    advance(this);
    pRVar2 = RankList::rank((this->_problem)._M_t.
                            super___uniq_ptr_impl<rank::RankList,_std::default_delete<rank::RankList>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_rank::RankList_*,_std::default_delete<rank::RankList>_>
                            .super__Head_base<0UL,_rank::RankList_*,_false>._M_head_impl);
    this->_rank = pRVar2;
    L(this,d + 1);
    this->_rank = (Rank *)0x0;
    bVar1 = advance_if(this,TK_RBracket);
    if (bVar1) {
      RC(this,d + 1);
      return;
    }
  }
  this->_ok = false;
  return;
}

Assistant:

void Parser::R(int d) {

        if (!token_available()) { _ok=false; return; }

        if (_token.type() == TK_LBracket) { // E -> ident X

#ifdef LOG_PRODUCTIONS
            std::cerr << std::string(4*d,'.') << "R -> '[' L ']' RC" << std::endl;
#endif

            advance();

            {
                _rank = _problem->rank(); // new rank
            }

            L(d+1);

            {
                _rank = nullptr; // new rank
            }

            if (!advance_if(TK_RBracket)) { _ok=false;  return; }

            RC(d+1);

        }
        else {
            _ok = false;
        }

    }